

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_StringTemplateInclude::Test_Template_StringTemplateInclude
          (Test_Template_StringTemplateInclude *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, StringTemplateInclude) {
  Template::ClearCache();   // just for exercise.
  const string cache_key = "TestStringTemplateInclude";
  const string cache_key_inc = "TestStringTemplateInclude-inc";
  const string cache_key_indent = "TestStringTemplateInclude-indent";
  const string text = "<html>{{>INC}}</html>";
  const string text_inc = "<div>\n<p>\nUser {{USER}}\n</div>";
  const string text_indent = "<html>\n  {{>INC}}</html>";

  ASSERT(Template::StringToTemplateCache(cache_key, text));
  ASSERT(Template::StringToTemplateCache(cache_key_inc, text_inc));
  ASSERT(Template::StringToTemplateCache(cache_key_indent, text_indent));

  Template *tpl = Template::GetTemplate(cache_key, DO_NOT_STRIP);
  ASSERT(tpl);

  TemplateDictionary dict("dict");
  TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
  sub_dict->SetFilename(cache_key_inc);

  sub_dict->SetValue("USER", "John<>Doe");
  string expected = "<html><div>\n<p>\nUser John<>Doe\n</div></html>";
  AssertExpandIs(tpl, &dict, expected, true);

  // Repeat the same except that now the parent has a template-level
  // directive (by way of the automatic-line-indenter).
  tpl = Template::GetTemplate(cache_key_indent, DO_NOT_STRIP);
  ASSERT(tpl);
  expected =
      "<html>\n"
      "  <div>\n"
      "  <p>\n"
      "  User John<>Doe\n"
      "  </div>"
      "</html>";
  AssertExpandIs(tpl, &dict, expected, true);

  Template::ClearCache();
}